

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall
wasm::BinaryInstWriter::visitStructCmpxchg(BinaryInstWriter *this,StructCmpxchg *curr)

{
  WasmBinaryWriter *this_00;
  bool bVar1;
  BufferWithRandomAccess *pBVar2;
  U32LEB local_2c;
  uintptr_t local_28;
  U32LEB local_1c;
  StructCmpxchg *local_18;
  StructCmpxchg *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (StructCmpxchg *)this;
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    emitUnreachable(this);
  }
  else {
    pBVar2 = BufferWithRandomAccess::operator<<(this->o,-2);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x66);
    BufferWithRandomAccess::operator<<(pBVar2,local_1c);
    WasmBinaryWriter::writeMemoryOrder(this->parent,local_18->order,true);
    this_00 = this->parent;
    local_28 = (uintptr_t)wasm::Type::getHeapType(&local_18->ref->type);
    WasmBinaryWriter::writeIndexedHeapType(this_00,(HeapType)local_28);
    pBVar2 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,local_18->index);
    BufferWithRandomAccess::operator<<(pBVar2,local_2c);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStructCmpxchg(StructCmpxchg* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::AtomicPrefix)
    << U32LEB(BinaryConsts::StructAtomicRMWCmpxchg);
  parent.writeMemoryOrder(curr->order, /*isRMW=*/true);
  parent.writeIndexedHeapType(curr->ref->type.getHeapType());
  o << U32LEB(curr->index);
}